

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_compute_blob.h
# Opt level: O2

void ncnn::gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int *piVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  compute_coord<(ncnn::GridSample::PaddingMode)3,_false> get_coord;
  
  iVar16 = grid->h * grid->w;
  piVar15 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    for (lVar12 = 0; lVar12 < grid->c; lVar12 = lVar12 + 1) {
      lVar11 = grid->cstep * grid->elemsize * lVar12;
      pvVar7 = grid->data;
      for (lVar14 = 0; (int)lVar14 < iVar16; lVar14 = lVar14 + 2) {
        fVar18 = *(float *)((long)pvVar7 + lVar14 * 4 + lVar11 + 4);
        fVar17 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                           (&get_coord,src->w,
                            (*(float *)((long)pvVar7 + lVar14 * 4 + lVar11) * 0.5 + 0.5) *
                            (float)src->w + -0.5);
        fVar18 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                           (&get_coord,src->h,(fVar18 * 0.5 + 0.5) * (float)src->h + -0.5);
        fVar19 = floorf(fVar17);
        fVar20 = floorf(fVar18);
        iVar21 = (int)fVar19;
        iVar22 = (int)fVar20;
        auVar25._0_4_ = -(uint)(-1 < iVar21);
        auVar25._4_4_ = -(uint)(-2 < iVar22);
        auVar25._8_4_ = -(uint)(-2 < iVar21);
        auVar25._12_4_ = -(uint)(-1 < iVar22);
        iVar1 = iVar21 + 1;
        iVar2 = iVar22 + 1;
        uVar4 = src->w;
        uVar9 = src->h;
        auVar28._0_4_ = -(uint)(iVar21 < (int)uVar4);
        auVar28._4_4_ = -(uint)(iVar2 < (int)uVar9);
        auVar28._8_4_ = -(uint)(iVar1 < (int)uVar4);
        auVar28._12_4_ = -(uint)(iVar22 < (int)uVar9);
        auVar28 = auVar28 & auVar25;
        auVar26._0_12_ = auVar28._4_12_;
        auVar26._12_4_ = auVar28._0_4_;
        auVar25 = auVar26 & auVar28 ^ _DAT_00559110;
        iVar10 = -1;
        iVar13 = (uVar4 * iVar22 + iVar21) * src->elempack;
        if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          iVar13 = iVar10;
        }
        *piVar15 = iVar13;
        iVar13 = iVar10;
        if ((auVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          iVar13 = (iVar22 * src->w + iVar1) * src->elempack;
        }
        piVar15[1] = iVar13;
        iVar13 = iVar10;
        if ((auVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          iVar13 = (src->w * iVar2 + iVar21) * src->elempack;
        }
        piVar15[2] = iVar13;
        if ((auVar25 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
          iVar10 = (iVar2 * src->w + iVar1) * src->elempack;
        }
        piVar15[3] = iVar10;
        piVar15[4] = (int)(fVar17 - (float)iVar21);
        piVar15[5] = (int)(fVar18 - (float)iVar22);
        piVar15 = piVar15 + 6;
      }
    }
  }
  else {
    sVar5 = grid->elemsize;
    sVar6 = grid->cstep;
    pvVar7 = grid->data;
    lVar12 = 0;
    if (iVar16 < 1) {
      iVar16 = 0;
    }
    for (; iVar16 != (int)lVar12; lVar12 = lVar12 + 1) {
      fVar18 = *(float *)((long)pvVar7 + lVar12 * 4 + sVar5 * sVar6);
      fVar17 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                         (&get_coord,src->w,
                          (*(float *)((long)pvVar7 + lVar12 * 4) * 0.5 + 0.5) * (float)src->w + -0.5
                         );
      fVar18 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                         (&get_coord,src->h,(fVar18 * 0.5 + 0.5) * (float)src->h + -0.5);
      fVar19 = floorf(fVar17);
      fVar20 = floorf(fVar18);
      iVar21 = (int)fVar19;
      iVar22 = (int)fVar20;
      auVar23._0_4_ = -(uint)(-1 < iVar21);
      auVar23._4_4_ = -(uint)(-2 < iVar22);
      auVar23._8_4_ = -(uint)(-2 < iVar21);
      auVar23._12_4_ = -(uint)(-1 < iVar22);
      iVar1 = iVar21 + 1;
      iVar2 = iVar22 + 1;
      uVar3 = src->w;
      uVar8 = src->h;
      auVar27._0_4_ = -(uint)(iVar21 < (int)uVar3);
      auVar27._4_4_ = -(uint)(iVar2 < (int)uVar8);
      auVar27._8_4_ = -(uint)(iVar1 < (int)uVar3);
      auVar27._12_4_ = -(uint)(iVar22 < (int)uVar8);
      auVar27 = auVar27 & auVar23;
      auVar24._0_12_ = auVar27._4_12_;
      auVar24._12_4_ = auVar27._0_4_;
      auVar25 = auVar24 & auVar27 ^ _DAT_00559110;
      iVar10 = -1;
      iVar13 = (uVar3 * iVar22 + iVar21) * src->elempack;
      if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        iVar13 = iVar10;
      }
      *piVar15 = iVar13;
      iVar13 = iVar10;
      if ((auVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        iVar13 = (iVar22 * src->w + iVar1) * src->elempack;
      }
      piVar15[1] = iVar13;
      iVar13 = iVar10;
      if ((auVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        iVar13 = (src->w * iVar2 + iVar21) * src->elempack;
      }
      piVar15[2] = iVar13;
      if ((auVar25 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
        iVar10 = (iVar2 * src->w + iVar1) * src->elempack;
      }
      piVar15[3] = iVar10;
      *(ulong *)(piVar15 + 4) = CONCAT44(fVar18 - (float)iVar22,fVar17 - (float)iVar21);
      piVar15 = piVar15 + 6;
    }
  }
  return;
}

Assistant:

void gridsample_2d_bilinear_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_value_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                __m256 x_w = _mm256_floor_ps(gx);
                __m256 y_n = _mm256_floor_ps(gy);

                __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
                __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));

                __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
                __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
                __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
                __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));

                __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                __m256 nw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w), _mm256_set1_ps(src.elempack));
                __m256 ne_offset = _mm256_add_ps(nw_offset, _mm256_set1_ps(src.elempack));
                __m256 sw_offset = _mm256_comp_fmadd_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack), nw_offset);
                __m256 se_offset = _mm256_add_ps(sw_offset, _mm256_set1_ps(src.elempack));

                nw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), nw_offset, v00_in_range);
                ne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), ne_offset, v01_in_range);
                sw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), sw_offset, v10_in_range);
                se_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), se_offset, v11_in_range);

                nw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(nw_offset));
                ne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(ne_offset));
                sw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(sw_offset));
                se_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(se_offset));

                __m256 alpha = _mm256_sub_ps(gx, x_w);
                __m256 beta = _mm256_sub_ps(gy, y_n);

                transpose8x6_ps(nw_offset, ne_offset, sw_offset, se_offset, alpha, beta);

                _mm256_storeu_ps(offset_value_ptr, nw_offset);
                _mm256_storeu_ps(offset_value_ptr + 8, ne_offset);
                _mm256_storeu_ps(offset_value_ptr + 16, sw_offset);
                _mm256_storeu_ps(offset_value_ptr + 24, se_offset);

                _mm256_storeu_ps(offset_value_ptr + 32, alpha);
                _mm256_storeu_ps(offset_value_ptr + 40, beta);

                gridptr += 16;
                offset_value_ptr += 48;
            }
#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                int x0 = (int)floorf(sample_x);
                int y0 = (int)floorf(sample_y);
                int x1 = x0 + 1;
                int y1 = y0 + 1;

                bool x0_in_bound = (x0 > -1) & (x0 < src.w);
                bool x1_in_bound = (x1 > -1) & (x1 < src.w);
                bool y0_in_bound = (y0 > -1) & (y0 < src.h);
                bool y1_in_bound = (y1 > -1) & (y1 < src.h);

                bool in_bound_00 = x0_in_bound & y0_in_bound;
                bool in_bound_01 = x1_in_bound & y0_in_bound;
                bool in_bound_10 = x0_in_bound & y1_in_bound;
                bool in_bound_11 = x1_in_bound & y1_in_bound;

                int* offset_ptr = (int*)offset_value_ptr;
                float* value_ptr = offset_value_ptr + 4;

                offset_ptr[0] = in_bound_00 ? (x0 + y0 * src.w) * src.elempack : -1.0;
                offset_ptr[1] = in_bound_01 ? (x1 + y0 * src.w) * src.elempack : -1.0;
                offset_ptr[2] = in_bound_10 ? (x0 + y1 * src.w) * src.elempack : -1.0;
                offset_ptr[3] = in_bound_11 ? (x1 + y1 * src.w) * src.elempack : -1.0;

                value_ptr[0] = sample_x - x0;
                value_ptr[1] = sample_y - y0;

                gridptr += 2;
                offset_value_ptr += 6;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            __m256 x_w = _mm256_floor_ps(gx);
            __m256 y_n = _mm256_floor_ps(gy);

            __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
            __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));

            __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
            __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
            __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
            __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));

            __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
            __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
            __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
            __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

            __m256 nw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w), _mm256_set1_ps(src.elempack));
            __m256 ne_offset = _mm256_add_ps(nw_offset, _mm256_set1_ps(src.elempack));
            __m256 sw_offset = _mm256_comp_fmadd_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack), nw_offset);
            __m256 se_offset = _mm256_add_ps(sw_offset, _mm256_set1_ps(src.elempack));

            nw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), nw_offset, v00_in_range);
            ne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), ne_offset, v01_in_range);
            sw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), sw_offset, v10_in_range);
            se_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), se_offset, v11_in_range);

            nw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(nw_offset));
            ne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(ne_offset));
            sw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(sw_offset));
            se_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(se_offset));

            __m256 alpha = _mm256_sub_ps(gx, x_w);
            __m256 beta = _mm256_sub_ps(gy, y_n);

            transpose8x6_ps(nw_offset, ne_offset, sw_offset, se_offset, alpha, beta);

            _mm256_storeu_ps(offset_value_ptr, nw_offset);
            _mm256_storeu_ps(offset_value_ptr + 8, ne_offset);
            _mm256_storeu_ps(offset_value_ptr + 16, sw_offset);
            _mm256_storeu_ps(offset_value_ptr + 24, se_offset);

            _mm256_storeu_ps(offset_value_ptr + 32, alpha);
            _mm256_storeu_ps(offset_value_ptr + 40, beta);

            gridptr_x += 8;
            gridptr_y += 8;
            offset_value_ptr += 48;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            int x0 = (int)floorf(sample_x);
            int y0 = (int)floorf(sample_y);
            int x1 = x0 + 1;
            int y1 = y0 + 1;

            bool x0_in_bound = (x0 > -1) & (x0 < src.w);
            bool x1_in_bound = (x1 > -1) & (x1 < src.w);
            bool y0_in_bound = (y0 > -1) & (y0 < src.h);
            bool y1_in_bound = (y1 > -1) & (y1 < src.h);

            bool in_bound_00 = x0_in_bound & y0_in_bound;
            bool in_bound_01 = x1_in_bound & y0_in_bound;
            bool in_bound_10 = x0_in_bound & y1_in_bound;
            bool in_bound_11 = x1_in_bound & y1_in_bound;

            int* offset_ptr = (int*)offset_value_ptr;
            float* value_ptr = offset_value_ptr + 4;

            offset_ptr[0] = in_bound_00 ? (x0 + y0 * src.w) * src.elempack : -1.0;
            offset_ptr[1] = in_bound_01 ? (x1 + y0 * src.w) * src.elempack : -1.0;
            offset_ptr[2] = in_bound_10 ? (x0 + y1 * src.w) * src.elempack : -1.0;
            offset_ptr[3] = in_bound_11 ? (x1 + y1 * src.w) * src.elempack : -1.0;

            value_ptr[0] = sample_x - x0;
            value_ptr[1] = sample_y - y0;

            gridptr_x++;
            gridptr_y++;
            offset_value_ptr += 6;
        }
    }
}